

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.h
# Opt level: O0

ssize_t quota_set(quota *quota,size_t new_total)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t __e;
  uint64_t *__ep;
  uint64_t new_value;
  uint32_t used_in_units;
  uint64_t value;
  uint32_t new_total_in_units;
  size_t new_total_local;
  quota *quota_local;
  
  if (0x3fffffffc00 < new_total) {
    __assert_fail("new_total <= QUOTA_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                  ,0x6c,"ssize_t quota_set(struct quota *, size_t)");
  }
  uVar3 = new_total + 0x3ff >> 10;
  uVar2 = (uint)uVar3;
  do {
    uVar1 = quota->value;
    if (uVar2 < (uint)uVar1) {
      return -1;
    }
    LOCK();
    uVar4 = quota->value;
    if (uVar1 == uVar4) {
      quota->value = CONCAT44(uVar2,(uint)uVar1);
      uVar4 = uVar1;
    }
    UNLOCK();
  } while (uVar4 != uVar1);
  return (uVar3 & 0xffffffff) << 10;
}

Assistant:

static inline ssize_t
quota_set(struct quota *quota, size_t new_total)
{
	assert(new_total <= QUOTA_MAX);
	/* Align the new total */
	uint32_t new_total_in_units = (new_total + (QUOTA_UNIT_SIZE - 1)) /
					QUOTA_UNIT_SIZE;
	while (1) {
		uint64_t value = quota->value;
		uint32_t used_in_units = value & UINT32_MAX;
		if (new_total_in_units < used_in_units)
			return  -1;
		uint64_t new_value =
			((uint64_t) new_total_in_units << 32) | used_in_units;
		if (pm_atomic_compare_exchange_weak(&quota->value, &value, new_value))
			break;
	}
	return new_total_in_units * QUOTA_UNIT_SIZE;
}